

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O2

void client(void *arg)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  undefined8 uStack_40;
  char msg [3];
  
  sVar3 = strlen(msg);
  iVar5 = -10;
  while( true ) {
    if (iVar5 == 0) {
      return;
    }
    iVar1 = nn_socket(1,0x50);
    if (iVar1 < 0) break;
    iVar2 = nn_connect(iVar1,"ipc://test-stress.ipc");
    if (iVar2 < 0) {
      nn_backtrace_print();
      pcVar4 = "nn_connect (cli_sock, SOCKET_ADDRESS) >= 0";
      uStack_40 = 0x5c;
      goto LAB_0010194e;
    }
    nn_sleep(0x32);
    iVar2 = nn_send(iVar1,msg,sVar3 + 1,0);
    nn_sleep(100);
    if (sVar3 + 1 != (long)iVar2) {
      nn_backtrace_print();
      pcVar4 = "(size_t)bytes == sz_msg";
      uStack_40 = 0x62;
      goto LAB_0010194e;
    }
    nn_close(iVar1);
    iVar5 = iVar5 + 1;
  }
  nn_backtrace_print();
  pcVar4 = "cli_sock >= 0";
  uStack_40 = 0x5b;
LAB_0010194e:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c",
          uStack_40);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void client(void *arg)
{
    intptr_t id = (intptr_t)arg;
    int bytes;
    char msg[3];
    size_t sz_msg;
    int i;

    msg[0] = 'A' + id%26;
    msg[1] = 'a';
    msg[2] = '\0';
    /*  '\0' too */
    sz_msg = strlen (msg) + 1;

    for (i = 0; i < TEST_LOOPS; i++) {
        int cli_sock = nn_socket (AF_SP, NN_PUSH);
        msg[1] = 'a' + i%26;
        nn_assert (cli_sock >= 0);
        nn_assert (nn_connect (cli_sock, SOCKET_ADDRESS) >= 0);
        /*  Give time to allow for connect to establish. */
        nn_sleep (50);
        bytes = nn_send (cli_sock, msg, sz_msg, 0);
        /*  This would better be handled via semaphore or condvar. */
        nn_sleep (100);
        nn_assert ((size_t)bytes == sz_msg);
        nn_close (cli_sock);
    }
}